

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDLoad(TranslateToFuzzReader *this)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  double dVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  int8_t iVar5;
  SIMDLoadOp SVar6;
  int iVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  long lVar10;
  
  this_00 = &this->random;
  lVar10 = 0;
  SVar6 = Random::
          pick<wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp>
                    (this_00,Load8SplatVec128,Load16SplatVec128,Load32SplatVec128,Load64SplatVec128,
                     Load8x8SVec128,Load8x8UVec128,Load16x4SVec128,Load16x4UVec128,Load32x2SVec128,
                     Load32x2UVec128);
  iVar5 = Random::get(this_00);
  dVar2 = log((double)(iVar5 + 1 + (uint)(iVar5 == -1)));
  switch(SVar6) {
  case Load8SplatVec128:
    lVar10 = 1;
    goto switchD_00142f51_default;
  case Load16SplatVec128:
    iVar7 = Random::pick<int,int>(this_00,1,2);
    break;
  case Load32SplatVec128:
    iVar7 = Random::pick<int,int,int>(this_00,1,2,4);
    break;
  case Load64SplatVec128:
  case Load8x8SVec128:
  case Load8x8UVec128:
  case Load16x4SVec128:
  case Load16x4UVec128:
  case Load32x2SVec128:
  case Load32x2UVec128:
    iVar7 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    break;
  case Load32ZeroVec128:
  case Load64ZeroVec128:
    ::wasm::handle_unreachable
              ("Unexpected SIMD loads",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xc2d);
  default:
    goto switchD_00142f51_default;
  }
  lVar10 = (long)iVar7;
switchD_00142f51_default:
  dVar2 = floor(dVar2);
  pEVar8 = makePointer(this);
  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((this->wasm->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
  uVar3 = *(undefined8 *)
           _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  uVar4 = *(uintptr_t *)
           ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
  pEVar9 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x40,8);
  pEVar9->_id = SIMDLoadId;
  (pEVar9->type).id = 0;
  pEVar9[1]._id = SVar6;
  pEVar9[1].type.id = (long)dVar2 & 0xffffffff;
  *(long *)(pEVar9 + 2) = lVar10;
  pEVar9[2].type.id = (uintptr_t)pEVar8;
  *(undefined8 *)(pEVar9 + 3) = uVar3;
  pEVar9[3].type.id = uVar4;
  ::wasm::SIMDLoad::finalize();
  return pEVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDLoad() {
  // TODO: add Load{32,64}Zero if merged to proposal
  SIMDLoadOp op = pick(Load8SplatVec128,
                       Load16SplatVec128,
                       Load32SplatVec128,
                       Load64SplatVec128,
                       Load8x8SVec128,
                       Load8x8UVec128,
                       Load16x4SVec128,
                       Load16x4UVec128,
                       Load32x2SVec128,
                       Load32x2UVec128);
  Address offset = logify(get());
  Address align;
  switch (op) {
    case Load8SplatVec128:
      align = 1;
      break;
    case Load16SplatVec128:
      align = pick(1, 2);
      break;
    case Load32SplatVec128:
      align = pick(1, 2, 4);
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
      align = pick(1, 2, 4, 8);
      break;
    case Load32ZeroVec128:
    case Load64ZeroVec128:
      WASM_UNREACHABLE("Unexpected SIMD loads");
  }
  Expression* ptr = makePointer();
  return builder.makeSIMDLoad(op, offset, align, ptr, wasm.memories[0]->name);
}